

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::ImmediatePromiseNode
          (ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *this,
          ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *result)

{
  ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *pEVar1;
  ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *result_local;
  ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *this_local;
  
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_00cc3038;
  pEVar1 = mv<kj::_::ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>(result);
  ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::ExceptionOr(&this->result,pEVar1);
  return;
}

Assistant:

ImmediatePromiseNode(ExceptionOr<T>&& result): result(kj::mv(result)) {}